

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O3

void amrex::parser_print(amrex_parser *parser)

{
  parser_node *node;
  AllPrint printer;
  string local_1b8;
  Print local_198;
  
  local_198.os = OutStream();
  local_198.rank = -1;
  local_198.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198.ss);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) =
       *(undefined8 *)(local_198.os + *(long *)(*(long *)local_198.os + -0x18) + 8);
  *(undefined8 *)(&local_198.field_0x18 + *(long *)(local_198._16_8_ + -0x18)) = 0x11;
  node = parser->ast;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"  ","");
  parser_ast_print(node,&local_1b8,(AllPrint *)&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  Print::~Print(&local_198);
  return;
}

Assistant:

void
parser_print (struct amrex_parser* parser)
{
    amrex::AllPrint printer{};
    printer.SetPrecision(17);
    parser_ast_print(parser->ast, std::string("  "), printer);
}